

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::UpsampleLayerParams::ByteSizeLong(UpsampleLayerParams *this)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  int index;
  
  iVar1 = (this->scalingfactor_).current_size_;
  uVar6 = 0;
  if (0 < iVar1) {
    index = 0;
    lVar8 = 0;
    do {
      puVar4 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->scalingfactor_,index);
      lVar2 = 0x3f;
      if ((*puVar4 | 1) != 0) {
        for (; (*puVar4 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      lVar8 = lVar8 + (ulong)((int)lVar2 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (iVar1 != index);
    if (lVar8 != 0) {
      if ((int)(uint)lVar8 < 0) {
        uVar7 = 0xb;
      }
      else {
        uVar3 = (uint)lVar8 | 1;
        iVar1 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
          }
        }
        uVar7 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
      }
      goto LAB_0022d93b;
    }
  }
  lVar8 = 0;
  uVar7 = 0;
LAB_0022d93b:
  this->_scalingfactor_cached_byte_size_ = (int)lVar8;
  lVar8 = uVar7 + lVar8;
  uVar7 = (ulong)(uint)(this->fractionalscalingfactor_).current_size_;
  lVar2 = uVar7 * 4;
  if (uVar7 != 0) {
    uVar6 = (uint)lVar2;
    if ((int)uVar6 < 0) {
      uVar7 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar6 | 1) != 0) {
        for (; (uVar6 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar7 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    lVar8 = lVar8 + uVar7;
  }
  this->_fractionalscalingfactor_cached_byte_size_ = uVar6;
  sVar5 = lVar8 + lVar2;
  uVar6 = this->mode_;
  if (uVar6 != 0) {
    if ((int)uVar6 < 0) {
      uVar7 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar6 | 1) != 0) {
        for (; (uVar6 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar7 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    sVar5 = sVar5 + uVar7;
  }
  uVar6 = this->linearupsamplemode_;
  if (uVar6 != 0) {
    if ((int)uVar6 < 0) {
      uVar7 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar6 | 1) != 0) {
        for (; (uVar6 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar7 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    sVar5 = sVar5 + uVar7;
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t UpsampleLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.UpsampleLayerParams)
  size_t total_size = 0;

  // repeated uint64 scalingFactor = 1;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->scalingfactor_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _scalingfactor_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated float fractionalScalingFactor = 7;
  {
    unsigned int count = this->fractionalscalingfactor_size();
    size_t data_size = 4UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _fractionalscalingfactor_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.UpsampleLayerParams.InterpolationMode mode = 5;
  if (this->mode() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->mode());
  }

  // .CoreML.Specification.UpsampleLayerParams.LinearUpsampleMode linearUpsampleMode = 6;
  if (this->linearupsamplemode() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->linearupsamplemode());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}